

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UObject * __thiscall
icu_63::ICUService::get
          (ICUService *this,UnicodeString *descriptor,UnicodeString *actualReturn,UErrorCode *status
          )

{
  int iVar1;
  undefined4 extraout_var;
  UObject *pUVar3;
  long *plVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,descriptor,status);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    pUVar3 = (UObject *)0x0;
  }
  else {
    iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[7])(this,plVar2,actualReturn,status);
    pUVar3 = (UObject *)CONCAT44(extraout_var_00,iVar1);
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  return pUVar3;
}

Assistant:

UObject* 
ICUService::get(const UnicodeString& descriptor, UnicodeString* actualReturn, UErrorCode& status) const 
{
    UObject* result = NULL;
    ICUServiceKey* key = createKey(&descriptor, status);
    if (key) {
        result = getKey(*key, actualReturn, status);
        delete key;
    }
    return result;
}